

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oauth2.c
# Opt level: O0

CURLcode Curl_auth_create_oauth_bearer_message
                   (Curl_easy *data,char *user,char *host,long port,char *bearer,char **outptr,
                   size_t *outlen)

{
  size_t insize;
  char *local_50;
  char *oauth;
  CURLcode result;
  char **outptr_local;
  char *bearer_local;
  long port_local;
  char *host_local;
  char *user_local;
  Curl_easy *data_local;
  
  if ((port == 0) || (port == 0x50)) {
    local_50 = curl_maprintf("n,a=%s,\x01host=%s\x01auth=Bearer %s\x01\x01",user,host,bearer);
  }
  else {
    local_50 = curl_maprintf("n,a=%s,\x01host=%s\x01port=%ld\x01auth=Bearer %s\x01\x01",user,host,
                             port,bearer);
  }
  if (local_50 == (char *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    insize = strlen(local_50);
    data_local._4_4_ = Curl_base64_encode(data,local_50,insize,outptr,outlen);
    (*Curl_cfree)(local_50);
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_auth_create_oauth_bearer_message(struct Curl_easy *data,
                                               const char *user,
                                               const char *host,
                                               const long port,
                                               const char *bearer,
                                               char **outptr, size_t *outlen)
{
  CURLcode result = CURLE_OK;
  char *oauth = NULL;

  /* Generate the message */
  if(port == 0 || port == 80)
    oauth = aprintf("n,a=%s,\1host=%s\1auth=Bearer %s\1\1", user, host,
                    bearer);
  else
    oauth = aprintf("n,a=%s,\1host=%s\1port=%ld\1auth=Bearer %s\1\1", user,
                    host, port, bearer);
  if(!oauth)
    return CURLE_OUT_OF_MEMORY;

  /* Base64 encode the reply */
  result = Curl_base64_encode(data, oauth, strlen(oauth), outptr, outlen);

  free(oauth);

  return result;
}